

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

void convert_to_params(double *params,int32_t *model)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  double *in_RDI;
  double dVar3;
  int diag_value;
  int i;
  int local_14;
  
  dVar3 = floor(*in_RDI * 64.0 + 0.5);
  *in_RSI = (int)dVar3;
  dVar3 = floor(in_RDI[1] * 64.0 + 0.5);
  in_RSI[1] = (int)dVar3;
  iVar1 = clamp(*in_RSI,-0x1000,0x1000);
  *in_RSI = iVar1 << 10;
  iVar1 = clamp(in_RSI[1],-0x1000,0x1000);
  in_RSI[1] = iVar1 << 10;
  for (local_14 = 2; local_14 < 6; local_14 = local_14 + 1) {
    iVar1 = 0;
    if (local_14 == 2 || local_14 == 5) {
      iVar1 = 0x8000;
    }
    dVar3 = floor(in_RDI[local_14] * 32768.0 + 0.5);
    in_RSI[local_14] = (int)dVar3;
    iVar2 = clamp(in_RSI[local_14] - iVar1,-0x1000,0x1000);
    in_RSI[local_14] = iVar2;
    in_RSI[local_14] = (in_RSI[local_14] + iVar1) * 2;
  }
  return;
}

Assistant:

static void convert_to_params(const double *params, int32_t *model) {
  int i;
  model[0] = (int32_t)floor(params[0] * (1 << GM_TRANS_PREC_BITS) + 0.5);
  model[1] = (int32_t)floor(params[1] * (1 << GM_TRANS_PREC_BITS) + 0.5);
  model[0] = (int32_t)clamp(model[0], GM_TRANS_MIN, GM_TRANS_MAX) *
             GM_TRANS_DECODE_FACTOR;
  model[1] = (int32_t)clamp(model[1], GM_TRANS_MIN, GM_TRANS_MAX) *
             GM_TRANS_DECODE_FACTOR;

  for (i = 2; i < 6; ++i) {
    const int diag_value = ((i == 2 || i == 5) ? (1 << GM_ALPHA_PREC_BITS) : 0);
    model[i] = (int32_t)floor(params[i] * (1 << GM_ALPHA_PREC_BITS) + 0.5);
    model[i] =
        (int32_t)clamp(model[i] - diag_value, GM_ALPHA_MIN, GM_ALPHA_MAX);
    model[i] = (model[i] + diag_value) * GM_ALPHA_DECODE_FACTOR;
  }
}